

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O0

void __thiscall
FlatMap<Point,double,PointCmp>::FlatMap<std::pair<Point,double>const*>
          (FlatMap<Point,_double,_PointCmp> *this,pair<Point,_double> *first,
          pair<Point,_double> *last,PointCmp *comp)

{
  iterator iVar1;
  iterator iVar2;
  __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  this_00;
  PointCmp *in_RCX;
  const_iterator in_RDX;
  anon_class_8_1_8991fb9c_for__M_comp in_RSI;
  long in_RDI;
  __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  newLast;
  vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>
  *in_stack_ffffffffffffff38;
  const_iterator __first;
  pair<Point,_double> *in_stack_ffffffffffffff70;
  pair<Point,_double> *in_stack_ffffffffffffff78;
  vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>
  *in_stack_ffffffffffffff80;
  pair<Point,_double> local_21;
  
  __first._M_current = &local_21;
  local_21.first._1_8_ = in_RCX;
  std::allocator<std::pair<Point,_double>_>::allocator
            ((allocator<std::pair<Point,_double>_> *)0x1f9875);
  std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>::
  vector<std::pair<Point,double>const*,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (allocator_type *)__first._M_current);
  std::allocator<std::pair<Point,_double>_>::~allocator
            ((allocator<std::pair<Point,_double>_> *)0x1f989d);
  FlatMap<Point,_double,_PointCmp>::ValueToKeyComparator::ValueToKeyComparator
            ((ValueToKeyComparator *)(in_RDI + 0x19),(PointCmp *)local_21.first._1_8_);
  FlatMap<Point,_double,_PointCmp>::ValueToValueComparator::ValueToValueComparator
            ((ValueToValueComparator *)(in_RDI + 0x1a),(PointCmp *)local_21.first._1_8_);
  iVar1 = std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::begin
                    (in_stack_ffffffffffffff38);
  iVar2 = std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::end
                    (in_stack_ffffffffffffff38);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::pair<Point,double>*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>,FlatMap<Point,double,PointCmp>::ValueToValueComparator>
            (iVar1._M_current,iVar2._M_current);
  std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::begin
            (in_stack_ffffffffffffff38);
  std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::end
            (in_stack_ffffffffffffff38);
  this_00 = std::
            unique<__gnu_cxx::__normal_iterator<std::pair<Point,double>*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>,FlatMap<Point,double,PointCmp>::FlatMap<std::pair<Point,double>const*>(std::pair<Point,double>const*,std::pair<Point,double>const*,PointCmp_const&)::_lambda(std::pair<Point,double>const&,std::pair<Point,double>const&)_1_>
                      (__first._M_current,in_RDX._M_current,in_RSI);
  __gnu_cxx::
  __normal_iterator<std::pair<Point,double>const*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>
  ::__normal_iterator<std::pair<Point,double>*>
            ((__normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
              *)this_00._M_current,
             (__normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
              *)in_stack_ffffffffffffff38);
  std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::end
            (in_stack_ffffffffffffff38);
  __gnu_cxx::
  __normal_iterator<std::pair<Point,double>const*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>
  ::__normal_iterator<std::pair<Point,double>*>
            ((__normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
              *)this_00._M_current,
             (__normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
              *)in_stack_ffffffffffffff38);
  std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::erase
            ((vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_> *)
             in_RSI.this,__first,in_RDX);
  return;
}

Assistant:

FlatMap(InputIt first, InputIt last, const Compare& comp = Compare()) :
        vec_(first, last),
        comp_(comp),
        valueToKeyComp_(comp),
        valueToValueComp_(comp) {

        std::stable_sort(vec_.begin(), vec_.end(), valueToValueComp_);
        auto newLast = std::unique(vec_.begin(), vec_.end(), [this](const value_type& lhs, const value_type& rhs) {
            return !comp_(lhs.first, rhs.first);
        });
        vec_.erase(newLast, vec_.end());

        //mergeUnique(first, last);
    }